

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseGlobalModuleField(WastParser *this,Module *module)

{
  long *plVar1;
  undefined8 uVar2;
  bool bVar3;
  Result RVar4;
  _Head_base<0UL,_wabt::Import_*,_false> _Var5;
  Enum EVar6;
  _Alloc_hider _Stack_e8;
  string name;
  undefined1 auStack_98 [8];
  Location loc;
  ModuleFieldList export_fields;
  unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> field;
  size_t local_50;
  undefined8 uStack_48;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_40;
  _Head_base<0UL,_wabt::GlobalModuleField_*,_false> local_38;
  _Head_base<0UL,_wabt::Import_*,_false> local_30;
  unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> import;
  
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)&stack0xffffffffffffff18,this);
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       name.field_2._M_allocated_capacity;
  auStack_98 = (undefined1  [8])_Stack_e8._M_p;
  loc.filename.data_ = name._M_dataplus._M_p;
  Token::~Token((Token *)&stack0xffffffffffffff18);
  RVar4 = Expect(this,Global);
  EVar6 = Error;
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length._0_1_ = 0;
  _Stack_e8._M_p = (pointer)&name._M_string_length;
  ParseBindVarOpt(this,(string *)&stack0xffffffffffffff18);
  loc.field_1._8_8_ = 0;
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  RVar4 = ParseInlineExports(this,(ModuleFieldList *)((long)&loc.field_1 + 8),Global);
  uVar2 = loc.field_1._8_8_;
  if (RVar4.enum_ == Error) goto joined_r0x00f7076b;
  bVar3 = PeekMatchLpar(this,Import);
  if (bVar3) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::GlobalImport,std::__cxx11::string&>
              ((wabt *)&local_30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff18);
    RVar4 = ParseInlineImport(this,local_30._M_head_impl);
    _Var5._M_head_impl = local_30._M_head_impl;
    if ((RVar4.enum_ != Error) &&
       (RVar4 = ParseGlobalType(this,(Global *)(local_30._M_head_impl + 1)),
       _Var5._M_head_impl = local_30._M_head_impl, RVar4.enum_ != Error)) {
      GetLocation((Location *)&export_fields.size_,this);
      local_40._M_head_impl = (ImportModuleField *)operator_new(0x48);
      _Var5._M_head_impl = local_30._M_head_impl;
      local_30._M_head_impl = (Import *)0x0;
      ((local_40._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
      ((local_40._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
      ((local_40._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      _vptr_ModuleField = (_func_int **)&PTR__ModuleField_0155b078;
      ((local_40._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.filename.data_ = (char *)export_fields.size_;
      ((local_40._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.filename.size_ =
           (size_type)
           field._M_t.
           super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
           .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl;
      ((local_40._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      loc.field_1.field_1.offset = local_50;
      *(undefined8 *)
       ((long)&((local_40._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
               super_ModuleField.loc.field_1 + 8) = uStack_48;
      ((local_40._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      type_ = Import;
      ((local_40._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).super_ModuleField.
      _vptr_ModuleField = (_func_int **)&PTR__ImportModuleField_0155b118;
      ((local_40._M_head_impl)->import)._M_t.
      super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
      super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = _Var5._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_40);
      if (local_40._M_head_impl != (ImportModuleField *)0x0) {
        (*((local_40._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_40._M_head_impl = (ImportModuleField *)0x0;
      _Var5._M_head_impl = local_30._M_head_impl;
LAB_00f70722:
      if (_Var5._M_head_impl != (Import *)0x0) {
        (*(_Var5._M_head_impl)->_vptr_Import[1])();
      }
      anon_unknown_1::AppendInlineExportFields
                (module,(ModuleFieldList *)((long)&loc.field_1 + 8),
                 (int)((ulong)((long)(module->globals).
                                     super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(module->globals).
                                    super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
      RVar4 = Expect(this,Rpar);
      EVar6 = (Enum)(RVar4.enum_ == Error);
      uVar2 = loc.field_1._8_8_;
      goto joined_r0x00f7076b;
    }
  }
  else {
    MakeUnique<wabt::GlobalModuleField,wabt::Location&,std::__cxx11::string&>
              ((wabt *)&export_fields.size_,(Location *)auStack_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff18);
    RVar4 = ParseGlobalType(this,(Global *)(export_fields.size_ + 0x40));
    _Var5._M_head_impl = (Import *)export_fields.size_;
    if ((RVar4.enum_ != Error) &&
       (RVar4 = ParseTerminatingInstrList(this,(ExprList *)(export_fields.size_ + 0x68)),
       _Var5._M_head_impl = (Import *)export_fields.size_, RVar4.enum_ != Error)) {
      local_38._M_head_impl = (GlobalModuleField *)export_fields.size_;
      export_fields.size_ = 0;
      Module::AppendField(module,(unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                                  *)&local_38);
      if (local_38._M_head_impl != (GlobalModuleField *)0x0) {
        (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).
          super_ModuleField._vptr_ModuleField[1])();
      }
      local_38._M_head_impl = (GlobalModuleField *)0x0;
      _Var5._M_head_impl = (Import *)export_fields.size_;
      goto LAB_00f70722;
    }
  }
  uVar2 = loc.field_1._8_8_;
  if (_Var5._M_head_impl != (Import *)0x0) {
    (*(_Var5._M_head_impl)->_vptr_Import[1])();
    uVar2 = loc.field_1._8_8_;
  }
joined_r0x00f7076b:
  while ((long *)uVar2 != (long *)0x0) {
    plVar1 = *(long **)(uVar2 + 8);
    (**(code **)(*(long *)uVar2 + 8))();
    uVar2 = plVar1;
  }
  if ((size_type *)_Stack_e8._M_p != &name._M_string_length) {
    operator_delete(_Stack_e8._M_p);
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseGlobalModuleField(Module* module) {
  WABT_TRACE(ParseGlobalModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Global);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Global));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<GlobalImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseGlobalType(&import->global));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = MakeUnique<GlobalModuleField>(loc, name);
    CHECK_RESULT(ParseGlobalType(&field->global));
    CHECK_RESULT(ParseTerminatingInstrList(&field->global.init_expr));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->globals.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}